

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserAnimation.cpp
# Opt level: O3

bool Rml::PropertyParserAnimation::ParseTransition(Property *property,StringList *transition_values)

{
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  code *pcVar2;
  Table<true,80ul,std::__cxx11::string,Rml::Keyword,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  *pTVar3;
  pointer pbVar4;
  Property *pPVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  bool bVar8;
  bool bVar9;
  PropertyId id_00;
  bool bVar10;
  int iVar11;
  size_t sVar12;
  ShorthandDefinition *pSVar13;
  PropertyDefinition *this_00;
  String *pSVar14;
  PropertyId id;
  pointer key;
  bool bVar15;
  long lVar16;
  PropertyIdSet PVar17;
  int count;
  PropertyIdSet target_property_ids;
  StringList arguments;
  float number;
  int local_134;
  undefined1 local_130 [8];
  Transition *local_128;
  iterator iStack_120;
  Transition *local_118;
  Transition local_110;
  PropertyIdSet local_e8;
  StringList local_d8;
  Property *local_b8;
  String *local_b0;
  String *local_a8;
  TransitionList local_a0;
  Variant local_80;
  undefined8 local_58;
  PropertyDefinition *pPStack_50;
  int local_48;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_38;
  
  local_130[0] = false;
  local_130[1] = false;
  local_128 = (Transition *)0x0;
  iStack_120._M_current = (Transition *)0x0;
  local_118 = (Transition *)0x0;
  pSVar14 = (transition_values->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (transition_values->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = property;
  if (pSVar14 == local_a8) {
LAB_0024deb4:
    pPVar5 = local_b8;
    Variant::Clear(&local_b8->value);
    Variant::Set(&pPVar5->value,(TransitionList *)local_130);
    pPVar5->unit = TRANSITION;
    bVar10 = true;
LAB_0024def6:
    if (local_128 != (Transition *)0x0) {
      operator_delete(local_128,(long)local_118 - (long)local_128);
    }
    return bVar10;
  }
LAB_0024dadf:
  local_110.id = Invalid;
  Tween::Tween(&local_110.tween,Linear,Out);
  local_110.duration = 0.0;
  local_110.delay = 0.0;
  local_110.reverse_adjustment_factor = 0.0;
  local_e8.defined_ids.super__Base_bitset<2UL>._M_w[0] = 0;
  local_e8.defined_ids.super__Base_bitset<2UL>._M_w[1] = 0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (String *)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (String *)0x0;
  local_b0 = pSVar14;
  StringUtilities::ExpandString(&local_d8,pSVar14,' ');
  pbVar4 = local_d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar15 = false;
    bVar10 = false;
    bVar9 = false;
    key = local_d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
LAB_0024db5a:
    if (key->_M_string_length != 0) {
      if ((DAT_0033b7d8 ==
           (Table<true,80ul,std::__cxx11::string,Rml::Keyword,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            *)0x0) &&
         (bVar8 = Assert("Resource used before it was initialized, or after it was shut down.",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                         ,0x46), !bVar8)) {
LAB_0024e003:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      pTVar3 = DAT_0033b7d8;
      sVar12 = robin_hood::detail::
               Table<true,80ul,std::__cxx11::string,Rml::Keyword,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
               ::findIdx<std::__cxx11::string>(DAT_0033b7d8,key);
      lVar16 = sVar12 * 0x38 + *(long *)pTVar3;
      if ((DAT_0033b7d8 ==
           (Table<true,80ul,std::__cxx11::string,Rml::Keyword,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            *)0x0) &&
         (bVar8 = Assert("Resource used before it was initialized, or after it was shut down.",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                         ,0x46), !bVar8)) goto LAB_0024e003;
      if (lVar16 != *(long *)(DAT_0033b7d8 + 8)) {
        uVar1 = *(uint *)(lVar16 + 0x20);
        if (uVar1 < 3) {
          if (uVar1 == 2) {
            if (iStack_120._M_current == local_128) {
              local_130[1] = true;
              goto LAB_0024dcfc;
            }
            goto LAB_0024dee9;
          }
          if (uVar1 == 0) {
            if (iStack_120._M_current != local_128) goto LAB_0024dee9;
            local_a0.none = true;
            local_a0.all = false;
            local_a0.transitions.
            super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_a0.transitions.
            super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a0.transitions.
            super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_80.type = NONE;
            Variant::Set(&local_80,&local_a0);
            pPVar5 = local_b8;
            local_58 = 0xffffffff00200000;
            local_40 = (element_type *)0x0;
            p_Stack_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pPStack_50 = (PropertyDefinition *)0x0;
            local_48 = -1;
            Variant::operator=(&local_b8->value,&local_80);
            p_Var7 = p_Stack_38;
            peVar6 = local_40;
            pPVar5->unit = (undefined4)local_58;
            pPVar5->specificity = local_58._4_4_;
            pPVar5->definition = pPStack_50;
            pPVar5->parser_index = local_48;
            local_40 = (element_type *)0x0;
            p_Stack_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (pPVar5->source).
                   super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            (pPVar5->source).
            super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar6;
            (pPVar5->source).
            super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = p_Var7;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_38);
            }
            Variant::~Variant(&local_80);
            if (local_a0.transitions.
                super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a0.transitions.
                              super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_a0.transitions.
                                    super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_a0.transitions.
                                    super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            bVar10 = true;
            goto LAB_0024deec;
          }
          local_110.tween._0_8_ = *(undefined8 *)(lVar16 + 0x28);
          local_110.tween.callback = *(CallbackFnc *)(lVar16 + 0x30);
          goto LAB_0024dcfc;
        }
      }
      local_80.type = local_80.type & 0xffffffff00000000;
      local_134 = 0;
      iVar11 = __isoc99_sscanf((key->_M_dataplus)._M_p,"%fs%n",&local_80,&local_134);
      if (iVar11 == 1) {
        if (local_134 < 1) {
          if (bVar9) goto LAB_0024dee9;
          local_110.reverse_adjustment_factor = (float)(undefined4)local_80.type;
          bVar9 = true;
        }
        else {
          if (bVar15) {
            if (bVar10) goto LAB_0024dee9;
            local_110.delay = (float)(undefined4)local_80.type;
            bVar10 = true;
          }
          else {
            local_110.duration = (float)(undefined4)local_80.type;
          }
          bVar15 = true;
        }
      }
      else {
        pSVar13 = StyleSheetSpecification::GetShorthand(key);
        if (pSVar13 == (ShorthandDefinition *)0x0) {
          this_00 = StyleSheetSpecification::GetProperty(key);
          if (this_00 == (PropertyDefinition *)0x0) goto LAB_0024dee9;
          id_00 = PropertyDefinition::GetId(this_00);
          PropertyIdSet::Insert(&local_e8,id_00);
        }
        else {
          PVar17 = StyleSheetSpecification::GetShorthandUnderlyingProperties(pSVar13->id);
          local_e8.defined_ids.super__Base_bitset<2UL>._M_w[0] =
               local_e8.defined_ids.super__Base_bitset<2UL>._M_w[0] |
               PVar17.defined_ids.super__Base_bitset<2UL>._M_w[0];
          local_e8.defined_ids.super__Base_bitset<2UL>._M_w[1] =
               local_e8.defined_ids.super__Base_bitset<2UL>._M_w[1] |
               PVar17.defined_ids.super__Base_bitset<2UL>._M_w[1];
        }
      }
    }
LAB_0024dcfc:
    key = key + 1;
    if (key == pbVar4) goto LAB_0024dd09;
    goto LAB_0024db5a;
  }
LAB_0024dd09:
  pSVar14 = local_b0;
  if ((bool)local_130[1] == true) {
    if ((local_e8.defined_ids.super__Base_bitset<2UL>._M_w[0] != 0 ||
        local_e8.defined_ids.super__Base_bitset<2UL>._M_w[1] != 0) || local_110.duration <= 0.0) {
LAB_0024dee9:
      bVar10 = false;
      goto LAB_0024deec;
    }
    bVar10 = false;
    if ((local_110.reverse_adjustment_factor < 0.0) ||
       (bVar10 = false, 1.0 < local_110.reverse_adjustment_factor)) goto LAB_0024deec;
    local_110.id = Invalid;
    if (iStack_120._M_current == local_118) {
      ::std::vector<Rml::Transition,std::allocator<Rml::Transition>>::
      _M_realloc_insert<Rml::Transition_const&>
                ((vector<Rml::Transition,std::allocator<Rml::Transition>> *)&local_128,iStack_120,
                 &local_110);
    }
    else {
      *(ulong *)&(iStack_120._M_current)->reverse_adjustment_factor =
           CONCAT44(local_110._36_4_,local_110.reverse_adjustment_factor);
      *(undefined4 *)&((iStack_120._M_current)->tween).callback = local_110.tween.callback._0_4_;
      *(undefined4 *)((long)&((iStack_120._M_current)->tween).callback + 4) =
           local_110.tween.callback._4_4_;
      (iStack_120._M_current)->duration = local_110.duration;
      (iStack_120._M_current)->delay = local_110.delay;
      *(ulong *)iStack_120._M_current = (ulong)(uint7)local_110._1_7_ << 8;
      ((iStack_120._M_current)->tween).type_in = local_110.tween.type_in;
      ((iStack_120._M_current)->tween).type_out = local_110.tween.type_out;
      iStack_120._M_current = iStack_120._M_current + 1;
    }
    goto LAB_0024de9a;
  }
  if (local_e8.defined_ids.super__Base_bitset<2UL>._M_w[0] == 0 &&
      local_e8.defined_ids.super__Base_bitset<2UL>._M_w[1] == 0 || local_110.duration <= 0.0)
  goto LAB_0024dee9;
  bVar10 = false;
  if ((0.0 <= local_110.reverse_adjustment_factor) && (local_110.reverse_adjustment_factor <= 1.0))
  {
    if (local_e8.defined_ids.super__Base_bitset<2UL>._M_w[0] != 0 ||
        local_e8.defined_ids.super__Base_bitset<2UL>._M_w[1] != 0) {
      sVar12 = 1;
      do {
        bVar10 = ::std::bitset<128UL>::test(&local_e8.defined_ids,sVar12);
        if (bVar10) goto LAB_0024de80;
        sVar12 = sVar12 + 1;
      } while (sVar12 != 0x80);
    }
    goto LAB_0024de9a;
  }
LAB_0024deec:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_d8);
  goto LAB_0024def6;
LAB_0024de80:
  while (sVar12 != 0x80) {
    local_110.id = (PropertyId)sVar12;
    if (iStack_120._M_current == local_118) {
      ::std::vector<Rml::Transition,std::allocator<Rml::Transition>>::
      _M_realloc_insert<Rml::Transition_const&>
                ((vector<Rml::Transition,std::allocator<Rml::Transition>> *)&local_128,iStack_120,
                 &local_110);
    }
    else {
      *(ulong *)&(iStack_120._M_current)->reverse_adjustment_factor =
           CONCAT44(local_110._36_4_,local_110.reverse_adjustment_factor);
      *(undefined4 *)&((iStack_120._M_current)->tween).callback = local_110.tween.callback._0_4_;
      *(undefined4 *)((long)&((iStack_120._M_current)->tween).callback + 4) =
           local_110.tween.callback._4_4_;
      (iStack_120._M_current)->duration = local_110.duration;
      (iStack_120._M_current)->delay = local_110.delay;
      *(ulong *)iStack_120._M_current = CONCAT71(local_110._1_7_,local_110.id);
      ((iStack_120._M_current)->tween).type_in = local_110.tween.type_in;
      ((iStack_120._M_current)->tween).type_out = local_110.tween.type_out;
      iStack_120._M_current = iStack_120._M_current + 1;
    }
    sVar12 = sVar12 + 1;
    if (sVar12 < 0x80) {
      while (bVar10 = ::std::bitset<128UL>::test(&local_e8.defined_ids,sVar12), !bVar10) {
        sVar12 = sVar12 + 1;
        if (sVar12 == 0x80) goto LAB_0024de9a;
      }
    }
  }
LAB_0024de9a:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_d8);
  pSVar14 = pSVar14 + 1;
  if (pSVar14 == local_a8) goto LAB_0024deb4;
  goto LAB_0024dadf;
}

Assistant:

bool PropertyParserAnimation::ParseTransition(Property& property, const StringList& transition_values)
{
	TransitionList transition_list{false, false, {}};

	for (const String& single_transition_value : transition_values)
	{
		Transition transition;
		PropertyIdSet target_property_ids;

		StringList arguments;
		StringUtilities::ExpandString(arguments, single_transition_value, ' ');

		bool duration_found = false;
		bool delay_found = false;
		bool reverse_adjustment_factor_found = false;

		for (auto& argument : arguments)
		{
			if (argument.empty())
				continue;

			// See if we have a <keyword> or <tween> specifier as defined in keywords
			auto it = parser_data->keywords.find(argument);
			if (it != parser_data->keywords.end() && it->second.ValidTransition())
			{
				if (it->second.type == KeywordType::None)
				{
					if (transition_list.transitions.size() > 0) // The none keyword can not be part of multiple definitions
						return false;
					property = Property{TransitionList{true, false, {}}, Unit::TRANSITION};
					return true;
				}
				else if (it->second.type == KeywordType::All)
				{
					if (transition_list.transitions.size() > 0) // The all keyword can not be part of multiple definitions
						return false;
					transition_list.all = true;
				}
				else if (it->second.type == KeywordType::Tween)
				{
					transition.tween = it->second.tween;
				}
			}
			else
			{
				// Either <duration>, <delay> or a <property name>
				float number = 0.0f;
				int count = 0;

				if (sscanf(argument.c_str(), "%fs%n", &number, &count) == 1)
				{
					// Found a number, if there was an 's' unit, count will be positive
					if (count > 0)
					{
						// Duration or delay was assigned
						if (!duration_found)
						{
							duration_found = true;
							transition.duration = number;
						}
						else if (!delay_found)
						{
							delay_found = true;
							transition.delay = number;
						}
						else
							return false;
					}
					else
					{
						// No 's' unit means reverse adjustment factor was found
						if (!reverse_adjustment_factor_found)
						{
							reverse_adjustment_factor_found = true;
							transition.reverse_adjustment_factor = number;
						}
						else
							return false;
					}
				}
				else
				{
					// Must be a property name or shorthand, expand now
					if (auto shorthand = StyleSheetSpecification::GetShorthand(argument))
					{
						PropertyIdSet underlying_properties = StyleSheetSpecification::GetShorthandUnderlyingProperties(shorthand->id);
						target_property_ids |= underlying_properties;
					}
					else if (auto definition = StyleSheetSpecification::GetProperty(argument))
					{
						// Single property
						target_property_ids.Insert(definition->GetId());
					}
					else
					{
						// Unknown property name
						return false;
					}
				}
			}
		}

		// Validate the parsed transition
		if ((transition_list.all && !target_property_ids.Empty())    //
			|| (!transition_list.all && target_property_ids.Empty()) //
			|| transition.duration <= 0.0f                           //
			|| transition.reverse_adjustment_factor < 0.0f           //
			|| transition.reverse_adjustment_factor > 1.0f           //
		)
		{
			return false;
		}

		if (transition_list.all)
		{
			transition.id = PropertyId::Invalid;
			transition_list.transitions.push_back(transition);
		}
		else
		{
			for (const PropertyId id : target_property_ids)
			{
				transition.id = id;
				transition_list.transitions.push_back(transition);
			}
		}
	}

	property.value = std::move(transition_list);
	property.unit = Unit::TRANSITION;

	return true;
}